

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_materials_array
rf_load_materials_from_mtl(char *filename,rf_allocator allocator,rf_io_callbacks io)

{
  anon_struct_76160_27_a7251cd6_for_rf_context_0 *paVar1;
  void *__dest;
  hash_table_t *in_R8;
  ulong uVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  bool bVar4;
  rf_materials_array rVar5;
  tinyobj_material_t *local_30;
  size_t local_28;
  
  if (filename == (char *)0x0) {
    sVar3 = 0;
  }
  else {
    *(void **)(in_FS_OFFSET + -0x430) = allocator.user_data;
    *(rf_allocator_proc **)(in_FS_OFFSET + -0x428) = allocator.allocator_proc;
    *(void **)(in_FS_OFFSET + -0x420) = io.user_data;
    *(_func_rf_int_void_ptr_char_ptr **)(in_FS_OFFSET + -0x418) = io.file_size_proc;
    *(_func__Bool_void_ptr_char_ptr_void_ptr_rf_int **)(in_FS_OFFSET + -0x410) = io.read_file_proc;
    local_28 = 0;
    local_30 = (tinyobj_material_t *)0x0;
    __dest = (void *)0x0;
    tinyobj_parse_and_index_mtl_file(&local_30,&local_28,filename,(file_reader_callback)0x0,in_R8);
    tinyobj_materials_free(local_30,0);
    sVar3 = local_28;
    *(undefined8 *)(in_FS_OFFSET + -0x420) = 0;
    *(undefined8 *)(in_FS_OFFSET + -0x418) = 0;
    *(undefined8 *)(in_FS_OFFSET + -0x410) = 0;
    *(undefined8 *)(in_FS_OFFSET + -0x430) = 0;
    *(undefined8 *)(in_FS_OFFSET + -0x428) = 0;
    paVar1 = &rf__ctx->field_0;
    uVar2 = 0;
    if (0 < (long)local_28) {
      uVar2 = local_28;
    }
    while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
      memcpy(__dest,&paVar1->default_shader,0x84);
      __dest = (void *)((long)__dest + 0x98);
    }
  }
  rVar5.materials = (rf_material *)0x0;
  rVar5.size = sVar3;
  return rVar5;
}

Assistant:

RF_API rf_materials_array rf_load_materials_from_mtl(const char* filename, rf_allocator allocator, rf_io_callbacks io)
{
    if (!filename) return (rf_materials_array) {0};

    rf_materials_array result = {0};

    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(allocator);
    RF_SET_TINYOBJ_IO_CALLBACKS(io);
    {
        size_t size = 0;
        tinyobj_material_t* mats = 0;
        if (tinyobj_parse_mtl_file(&mats, (size_t*) &size, filename, rf_tinyobj_file_reader_callback) != TINYOBJ_SUCCESS)
        {
            // Log Error
        }
        tinyobj_materials_free(mats, result.size);

        result.size = size;
    }
    RF_SET_TINYOBJ_IO_CALLBACKS(RF_NULL_IO);
    RF_SET_GLOBAL_DEPENDENCIES_ALLOCATOR(RF_NULL_ALLOCATOR);

    // Set materials shader to default (DIFFUSE, SPECULAR, NORMAL)
    for (rf_int i = 0; i < result.size; i++)
    {
        result.materials[i].shader = rf_get_default_shader();
    }

    return result;
}